

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O1

void __thiscall TPZShapeData::TPZShapeData(TPZShapeData *this)

{
  double *pdVar1;
  long lVar2;
  
  *(undefined ***)this = &PTR__TPZShapeData_018de998;
  this->fShapeType = EEmpty;
  TPZVec<long>::TPZVec(&(this->fCornerNodeIds).super_TPZVec<long>,0);
  (this->fCornerNodeIds).super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840b58
  ;
  (this->fCornerNodeIds).super_TPZVec<long>.fStore = (this->fCornerNodeIds).fExtAlloc;
  (this->fCornerNodeIds).super_TPZVec<long>.fNElements = 0;
  (this->fCornerNodeIds).super_TPZVec<long>.fNAlloc = 0;
  TPZVec<int>::TPZVec(&(this->fH1ConnectOrders).super_TPZVec<int>,0);
  (this->fH1ConnectOrders).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01840098;
  (this->fH1ConnectOrders).super_TPZVec<int>.fStore = (this->fH1ConnectOrders).fExtAlloc;
  (this->fH1ConnectOrders).super_TPZVec<int>.fNElements = 0;
  (this->fH1ConnectOrders).super_TPZVec<int>.fNAlloc = 0;
  TPZVec<int>::TPZVec(&(this->fH1NumConnectShape).super_TPZVec<int>,0);
  (this->fH1NumConnectShape).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01840098;
  (this->fH1NumConnectShape).super_TPZVec<int>.fStore = (this->fH1NumConnectShape).fExtAlloc;
  (this->fH1NumConnectShape).super_TPZVec<int>.fNElements = 0;
  (this->fH1NumConnectShape).super_TPZVec<int>.fNAlloc = 0;
  TPZManVector<TPZTransform<double>,_20>::TPZManVector(&this->fSideTransforms,0);
  TPZVec<int>::TPZVec(&(this->fSideTransformationId).super_TPZVec<int>,0);
  (this->fSideTransformationId).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01840040;
  (this->fSideTransformationId).super_TPZVec<int>.fStore = (this->fSideTransformationId).fExtAlloc;
  pdVar1 = (this->fPhi).fBuf;
  (this->fSideTransformationId).super_TPZVec<int>.fNElements = 0;
  (this->fSideTransformationId).super_TPZVec<int>.fNAlloc = 0;
  (this->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
       '\0';
  (this->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive =
       '\0';
  (this->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183ef60;
  (this->fPhi).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fPhi).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fPhi).super_TPZFMatrix<double>.fSize = 0x3c;
  TPZVec<int>::TPZVec(&(this->fPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fPhi).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fPhi).super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fPhi).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fPhi).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fPhi).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fPhi).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0183ec70;
  pdVar1 = (this->fDPhi).fBuf;
  (this->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
       '\0';
  (this->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive =
       '\0';
  (this->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018403e8;
  (this->fDPhi).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fDPhi).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fDPhi).super_TPZFMatrix<double>.fSize = 0xb4;
  TPZVec<int>::TPZVec(&(this->fDPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fDPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fDPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fDPhi).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fDPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fDPhi).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fDPhi).super_TPZFMatrix<double>.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fDPhi).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fDPhi).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fDPhi).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fDPhi).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_018400f8;
  TPZVec<int>::TPZVec(&(this->fHDivConnectOrders).super_TPZVec<int>,0);
  (this->fHDivConnectOrders).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01840098;
  (this->fHDivConnectOrders).super_TPZVec<int>.fStore = (this->fHDivConnectOrders).fExtAlloc;
  (this->fHDivConnectOrders).super_TPZVec<int>.fNElements = 0;
  (this->fHDivConnectOrders).super_TPZVec<int>.fNAlloc = 0;
  TPZVec<int>::TPZVec(&(this->fHDivNumConnectShape).super_TPZVec<int>,0);
  (this->fHDivNumConnectShape).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01840098;
  (this->fHDivNumConnectShape).super_TPZVec<int>.fStore = (this->fHDivNumConnectShape).fExtAlloc;
  (this->fHDivNumConnectShape).super_TPZVec<int>.fNElements = 0;
  (this->fHDivNumConnectShape).super_TPZVec<int>.fNAlloc = 0;
  TPZVec<int>::TPZVec(&(this->fSideOrient).super_TPZVec<int>,0);
  (this->fSideOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01840040;
  (this->fSideOrient).super_TPZVec<int>.fStore = (this->fSideOrient).fExtAlloc;
  pdVar1 = (this->fMasterDirections).fBuf;
  (this->fSideOrient).super_TPZVec<int>.fNElements = 0;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
  (this->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fRow = 0;
  (this->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fCol = 0;
  (this->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDecomposed = '\0';
  (this->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_0183f978;
  (this->fMasterDirections).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fMasterDirections).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fMasterDirections).super_TPZFMatrix<double>.fSize = 0xf3;
  TPZVec<int>::TPZVec(&(this->fMasterDirections).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0
                     );
  (this->fMasterDirections).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fMasterDirections).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fMasterDirections).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fMasterDirections).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fMasterDirections).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fMasterDirections).super_TPZFMatrix<double>.fWork._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fMasterDirections).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fMasterDirections).super_TPZFMatrix<double>.fWork.fNElements = 0;
  lVar2 = 0;
  (this->fMasterDirections).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fMasterDirections).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_0183f688;
  (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore = (pair<int,_long> *)0x0;
  (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements = 0;
  (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNAlloc = 0;
  (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183f628;
  do {
    *(undefined4 *)((long)&(this->fSDVecShapeIndex).fExtAlloc[0].first + lVar2) = 0;
    *(undefined8 *)((long)&(this->fSDVecShapeIndex).fExtAlloc[0].second + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x3c0);
  (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore =
       (this->fSDVecShapeIndex).fExtAlloc;
  (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements = 0;
  (this->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNAlloc = 0;
  return;
}

Assistant:

TPZShapeData::TPZShapeData() :
    TPZRegisterClassId(&TPZShapeData::ClassId)
{

}